

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acb.h
# Opt level: O3

void Acb_ObjRemoveFaninFanoutOne(Acb_Ntk_t *p,int iObj,int iFanin)

{
  ulong uVar1;
  uint *puVar2;
  uint uVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  int *pFanins;
  long lVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  bool bVar11;
  
  if ((iFanin < 0) || ((p->vFanouts).nSize <= iFanin)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWec.h"
                  ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
  }
  pVVar4 = (p->vFanouts).pArray;
  iVar8 = pVVar4[(uint)iFanin].nSize;
  if ((long)iVar8 < 1) {
    if (iVar8 != 0) {
      __assert_fail("i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                    ,0x3e5,"int Vec_IntRemove(Vec_Int_t *, int)");
    }
LAB_00380c8f:
    __assert_fail("RetValue",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                  ,0x21a,"void Acb_ObjRemoveFaninFanoutOne(Acb_Ntk_t *, int, int)");
  }
  piVar5 = pVVar4[(uint)iFanin].pArray;
  lVar10 = 1;
  while (piVar5[lVar10 + -1] != iObj) {
    bVar11 = lVar10 == iVar8;
    lVar10 = lVar10 + 1;
    if (bVar11) goto LAB_00380c8f;
  }
  if ((int)lVar10 < iVar8) {
    do {
      piVar5[lVar10 + -1] = piVar5[lVar10];
      lVar10 = lVar10 + 1;
      iVar8 = pVVar4[(uint)iFanin].nSize;
    } while ((int)lVar10 < iVar8);
  }
  pVVar4[(uint)iFanin].nSize = iVar8 + -1;
  if (iObj < 1) {
    __assert_fail("i>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                  ,0xfe,"int Acb_ObjFanOffset(Acb_Ntk_t *, int)");
  }
  if ((p->vObjFans).nSize <= iObj) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar8 = (p->vObjFans).pArray[(uint)iObj];
  if (((long)iVar8 < 0) || ((p->vFanSto).nSize <= iVar8)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                  ,0x1b8,"int *Vec_IntEntryP(Vec_Int_t *, int)");
  }
  puVar2 = (uint *)((p->vFanSto).pArray + iVar8);
  uVar3 = *puVar2;
  uVar9 = 0;
  uVar7 = 0;
  if (0 < (int)uVar3) {
    uVar9 = (ulong)uVar3;
  }
  do {
    if (uVar9 == uVar7) {
      iVar8 = -1;
      goto LAB_00380d39;
    }
    uVar1 = uVar7 + 1;
    lVar10 = uVar7 + 1;
    uVar7 = uVar1;
  } while (puVar2[lVar10] != iFanin);
  iVar8 = (int)uVar1 + -1;
LAB_00380d39:
  lVar10 = (long)iVar8;
  if (puVar2[lVar10 + 1] == iFanin) {
    lVar6 = (long)(int)uVar3 + -1;
    *puVar2 = (uint)lVar6;
    if (iVar8 < (int)(uint)lVar6) {
      do {
        puVar2[lVar10 + 1] = puVar2[lVar10 + 2];
        lVar10 = lVar10 + 1;
        lVar6 = (long)(int)*puVar2;
      } while (lVar10 < lVar6);
    }
    puVar2[lVar6 + 1] = 0xffffffff;
    return;
  }
  __assert_fail("pFanins[ 1 + iFaninIndex ] == iFanin",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                ,0x1b3,"void Acb_ObjDeleteFanin(Acb_Ntk_t *, int, int)");
}

Assistant:

static inline void Acb_ObjRemoveFaninFanoutOne( Acb_Ntk_t * p, int iObj, int iFanin )
{
    int RetValue = Vec_IntRemove( Vec_WecEntry(&p->vFanouts, iFanin), iObj );
    assert( RetValue );
    Acb_ObjDeleteFanin( p, iObj, iFanin );
}